

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O1

void __thiscall
TPZMHMeshControl::ConnectedElements
          (TPZMHMeshControl *this,int64_t skeleton,pair<long,_long> *leftright,
          map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
          *ellist)

{
  size_t *psVar1;
  TPZGeoEl *pTVar2;
  int iVar3;
  TPZGeoEl **ppTVar4;
  long lVar5;
  mapped_type *pmVar6;
  _List_node_base *p_Var7;
  ostream *poVar8;
  long *plVar9;
  int iVar10;
  _List_node_base *p_Var11;
  TPZCompElSide celside;
  list<TPZCompElSide,_std::allocator<TPZCompElSide>_> allconnected;
  TPZGeoElSide gelside;
  long local_98;
  TPZCompElSide local_90;
  int64_t local_80;
  _List_node_base local_78;
  undefined8 local_68;
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  
  ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      (&(((this->fGMesh).fRef)->fPointer->fElementVec).
                        super_TPZChunkVector<TPZGeoEl_*,_10>,skeleton);
  pTVar2 = *ppTVar4;
  iVar10 = ((this->fGMesh).fRef)->fPointer->fDim;
  iVar3 = (**(code **)(*(long *)pTVar2 + 0x210))(pTVar2);
  if (iVar3 != iVar10 + -1) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x813);
  }
  local_80 = skeleton;
  local_48.fSide = (**(code **)(*(long *)pTVar2 + 0xf0))(pTVar2);
  local_48.fSide = local_48.fSide + -1;
  local_68 = 0;
  local_48.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
  local_78._M_next = &local_78;
  local_78._M_prev = &local_78;
  local_48.fGeoEl = pTVar2;
  BuildConnectedElementList
            (this,&local_48,(list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *)&local_78);
  p_Var11 = local_78._M_next;
  do {
    if (p_Var11 == &local_78) {
      if ((ellist->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                   ,0x843);
      }
      if ((leftright->second == local_80) &&
         ((ellist->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 1)) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                   ,0x847);
      }
      p_Var11 = local_78._M_next;
      if ((leftright->second != local_80) &&
         ((ellist->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 2)) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                   ,0x84c);
      }
      while (p_Var11 != &local_78) {
        p_Var7 = p_Var11->_M_next;
        operator_delete(p_Var11,0x20);
        p_Var11 = p_Var7;
      }
      return;
    }
    local_90.fEl = (TPZCompEl *)p_Var11[1]._M_next;
    local_90.fSide = *(int *)&p_Var11[1]._M_prev;
    TPZCompElSide::Reference(&local_60,&local_90);
    iVar10 = (int)(this->fGeoToMHMDomain).super_TPZVec<long>.fStore[(local_60.fGeoEl)->fIndex];
    lVar5 = (long)iVar10;
    if (lVar5 == leftright->first) {
      local_98 = lVar5;
      pmVar6 = std::
               map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
               ::operator[](ellist,&local_98);
      p_Var7 = (_List_node_base *)operator_new(0x20);
LAB_013bf8ef:
      p_Var7[1]._M_next = (_List_node_base *)local_90.fEl;
      *(int *)&p_Var7[1]._M_prev = local_90.fSide;
      std::__detail::_List_node_base::_M_hook(p_Var7);
      psVar1 = &(pmVar6->super__List_base<TPZCompElSide,_std::allocator<TPZCompElSide>_>)._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      if (lVar5 == leftright->second) {
        local_98 = lVar5;
        pmVar6 = std::
                 map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                 ::operator[](ellist,&local_98);
        p_Var7 = (_List_node_base *)operator_new(0x20);
        goto LAB_013bf8ef;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"I dont understand leftright : ",0x1e);
      poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      poVar8 = std::ostream::_M_insert<long>((long)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," mhm_domain ",0xc);
      plVar9 = (long *)std::ostream::operator<<(poVar8,iVar10);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
    }
    p_Var11 = (((_List_base<TPZCompElSide,_std::allocator<TPZCompElSide>_> *)&p_Var11->_M_next)->
              _M_impl)._M_node.super__List_node_base._M_next;
  } while( true );
}

Assistant:

void TPZMHMeshControl::ConnectedElements(int64_t skeleton, std::pair<int64_t,int64_t> &leftright, std::map<int64_t, std::list<TPZCompElSide> > &ellist)
{
    TPZGeoEl *gelskeleton = fGMesh->Element(skeleton);
    int meshdim = fGMesh->Dimension();
    if (gelskeleton->Dimension() != meshdim-1) {
        DebugStop();
    }
    TPZGeoElSide skelside(gelskeleton,gelskeleton->NSides()-1);

    std::list<TPZCompElSide> allconnected;
    BuildConnectedElementList(skelside, allconnected);
    
#ifdef PZDEBUG
    // verify if the acumulated area of allconnected is the area of the element
    REAL area = gelskeleton->SideArea(gelskeleton->NSides()-1);
    REAL listarea = 0.;
    for(auto it : allconnected)
    {
        TPZGeoElSide gside = it.Reference();
        listarea += gside.Area();
    }
    REAL diff = fabs(area-listarea);
    REAL diff2 = fabs(2*area - listarea);
    if(diff > 1.e-3*area && diff2 >= 1.e-3*area)
    {
        std::cout << "The area of the connected elements does not correspond to the area " <<
        "of the skeleton element area = " << area << " listarea = " << listarea <<
        " diff/area = " << diff/area << " diff2/area " << diff2/area << std::endl;
    }
#endif
    
    for(auto celside : allconnected)
    {
        TPZGeoElSide gelside = celside.Reference();
        TPZGeoEl *gel = gelside.Element();
        int64_t gelindex = gel->Index();
        int mhm_domain = fGeoToMHMDomain[gelindex];
        if(mhm_domain == leftright.first)
        {
            ellist[mhm_domain].push_back(celside);
        }
        else if(mhm_domain == leftright.second)
        {
            ellist[mhm_domain].push_back(celside);
        }
        else
        {
            std::cout << "I dont understand leftright : " << leftright.first << " " <<
            leftright.second << " mhm_domain " << mhm_domain << std::endl;
        }
    }
    // a skeleton element with no computational elements is a bug
    if (ellist.size() == 0) {
        DebugStop();
    }
    // if the skeleton is boundary and if there are more than one subdomain, it is a bug
    if (skeleton == leftright.second && ellist.size() != 1) {
        DebugStop();
    }
    // if the skeleton is not boundary then there must be exactly two subdomains connected
    if(skeleton != leftright.second && ellist.size() != 2)
    {
        DebugStop();
    }
}